

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

void __thiscall YAML::Parser::ParseDirectives(Parser *this)

{
  bool bVar1;
  bool bVar2;
  Token *token;
  Directives *this_00;
  
  bVar1 = Scanner::empty((this->m_pScanner)._M_t.
                         super___uniq_ptr_impl<YAML::Scanner,_std::default_delete<YAML::Scanner>_>.
                         _M_t.
                         super__Tuple_impl<0UL,_YAML::Scanner_*,_std::default_delete<YAML::Scanner>_>
                         .super__Head_base<0UL,_YAML::Scanner_*,_false>._M_head_impl);
  if (!bVar1) {
    bVar1 = false;
    do {
      token = Scanner::peek((this->m_pScanner)._M_t.
                            super___uniq_ptr_impl<YAML::Scanner,_std::default_delete<YAML::Scanner>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_YAML::Scanner_*,_std::default_delete<YAML::Scanner>_>
                            .super__Head_base<0UL,_YAML::Scanner_*,_false>._M_head_impl);
      if (token->type != DIRECTIVE) {
        return;
      }
      if (!bVar1) {
        this_00 = (Directives *)operator_new(0x40);
        Directives::Directives(this_00);
        std::__uniq_ptr_impl<YAML::Directives,_std::default_delete<YAML::Directives>_>::reset
                  ((__uniq_ptr_impl<YAML::Directives,_std::default_delete<YAML::Directives>_> *)
                   &this->m_pDirectives,this_00);
      }
      HandleDirective(this,token);
      Scanner::pop((this->m_pScanner)._M_t.
                   super___uniq_ptr_impl<YAML::Scanner,_std::default_delete<YAML::Scanner>_>._M_t.
                   super__Tuple_impl<0UL,_YAML::Scanner_*,_std::default_delete<YAML::Scanner>_>.
                   super__Head_base<0UL,_YAML::Scanner_*,_false>._M_head_impl);
      bVar2 = Scanner::empty((this->m_pScanner)._M_t.
                             super___uniq_ptr_impl<YAML::Scanner,_std::default_delete<YAML::Scanner>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_YAML::Scanner_*,_std::default_delete<YAML::Scanner>_>
                             .super__Head_base<0UL,_YAML::Scanner_*,_false>._M_head_impl);
      bVar1 = true;
    } while (!bVar2);
  }
  return;
}

Assistant:

void Parser::ParseDirectives() {
  bool readDirective = false;

  while (!m_pScanner->empty()) {
    Token& token = m_pScanner->peek();
    if (token.type != Token::DIRECTIVE) {
      break;
    }

    // we keep the directives from the last document if none are specified;
    // but if any directives are specific, then we reset them
    if (!readDirective) {
      m_pDirectives.reset(new Directives);
    }

    readDirective = true;
    HandleDirective(token);
    m_pScanner->pop();
  }
}